

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_functions.cpp
# Opt level: O2

void duckdb::PragmaFunctions::RegisterFunction(BuiltinFunctions *set)

{
  allocator local_1c99;
  string local_1c98;
  PragmaFunction local_1c78;
  PragmaFunction local_1b60;
  PragmaFunction local_1a48;
  PragmaFunction local_1930;
  PragmaFunction local_1818;
  PragmaFunction local_1700;
  PragmaFunction local_15e8;
  PragmaFunction local_14d0;
  PragmaFunction local_13b8;
  PragmaFunction local_12a0;
  PragmaFunction local_1188;
  PragmaFunction local_1070;
  PragmaFunction local_f58;
  PragmaFunction local_e40;
  PragmaFunction local_d28;
  PragmaFunction local_c10;
  PragmaFunction local_af8;
  PragmaFunction local_9e0;
  PragmaFunction local_8c8;
  PragmaFunction local_7b0;
  PragmaFunction local_698;
  PragmaFunction local_580;
  PragmaFunction local_468;
  PragmaFunction local_350;
  PragmaFunction local_238;
  PragmaFunction local_120;
  
  RegisterEnableProfiling(set);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_profile",&local_1c99);
  PragmaFunction::PragmaStatement(&local_120,&local_1c98,PragmaDisableProfiling);
  BuiltinFunctions::AddFunction(set,&local_120);
  PragmaFunction::~PragmaFunction(&local_120);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_profiling",&local_1c99);
  PragmaFunction::PragmaStatement(&local_238,&local_1c98,PragmaDisableProfiling);
  BuiltinFunctions::AddFunction(set,&local_238);
  PragmaFunction::~PragmaFunction(&local_238);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_verification",&local_1c99);
  PragmaFunction::PragmaStatement(&local_350,&local_1c98,PragmaEnableVerification);
  BuiltinFunctions::AddFunction(set,&local_350);
  PragmaFunction::~PragmaFunction(&local_350);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_verification",&local_1c99);
  PragmaFunction::PragmaStatement(&local_468,&local_1c98,PragmaDisableVerification);
  BuiltinFunctions::AddFunction(set,&local_468);
  PragmaFunction::~PragmaFunction(&local_468);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"verify_external",&local_1c99);
  PragmaFunction::PragmaStatement(&local_580,&local_1c98,PragmaEnableExternalVerification);
  BuiltinFunctions::AddFunction(set,&local_580);
  PragmaFunction::~PragmaFunction(&local_580);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_verify_external",&local_1c99);
  PragmaFunction::PragmaStatement(&local_698,&local_1c98,PragmaDisableExternalVerification);
  BuiltinFunctions::AddFunction(set,&local_698);
  PragmaFunction::~PragmaFunction(&local_698);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"verify_fetch_row",&local_1c99);
  PragmaFunction::PragmaStatement(&local_7b0,&local_1c98,PragmaEnableFetchRowVerification);
  BuiltinFunctions::AddFunction(set,&local_7b0);
  PragmaFunction::~PragmaFunction(&local_7b0);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_verify_fetch_row",&local_1c99);
  PragmaFunction::PragmaStatement(&local_8c8,&local_1c98,PragmaDisableFetchRowVerification);
  BuiltinFunctions::AddFunction(set,&local_8c8);
  PragmaFunction::~PragmaFunction(&local_8c8);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"verify_serializer",&local_1c99);
  PragmaFunction::PragmaStatement(&local_9e0,&local_1c98,PragmaVerifySerializer);
  BuiltinFunctions::AddFunction(set,&local_9e0);
  PragmaFunction::~PragmaFunction(&local_9e0);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_verify_serializer",&local_1c99);
  PragmaFunction::PragmaStatement(&local_af8,&local_1c98,PragmaDisableVerifySerializer);
  BuiltinFunctions::AddFunction(set,&local_af8);
  PragmaFunction::~PragmaFunction(&local_af8);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"verify_parallelism",&local_1c99);
  PragmaFunction::PragmaStatement(&local_c10,&local_1c98,PragmaEnableForceParallelism);
  BuiltinFunctions::AddFunction(set,&local_c10);
  PragmaFunction::~PragmaFunction(&local_c10);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_verify_parallelism",&local_1c99);
  PragmaFunction::PragmaStatement(&local_d28,&local_1c98,PragmaDisableForceParallelism);
  BuiltinFunctions::AddFunction(set,&local_d28);
  PragmaFunction::~PragmaFunction(&local_d28);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_object_cache",&local_1c99);
  PragmaFunction::PragmaStatement(&local_e40,&local_1c98,PragmaEnableObjectCache);
  BuiltinFunctions::AddFunction(set,&local_e40);
  PragmaFunction::~PragmaFunction(&local_e40);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_object_cache",&local_1c99);
  PragmaFunction::PragmaStatement(&local_f58,&local_1c98,PragmaDisableObjectCache);
  BuiltinFunctions::AddFunction(set,&local_f58);
  PragmaFunction::~PragmaFunction(&local_f58);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_logging",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1070,&local_1c98,PragmaEnableLogging);
  BuiltinFunctions::AddFunction(set,&local_1070);
  PragmaFunction::~PragmaFunction(&local_1070);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_logging",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1188,&local_1c98,PragmaDisableLogging);
  BuiltinFunctions::AddFunction(set,&local_1188);
  PragmaFunction::~PragmaFunction(&local_1188);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_optimizer",&local_1c99);
  PragmaFunction::PragmaStatement(&local_12a0,&local_1c98,PragmaEnableOptimizer);
  BuiltinFunctions::AddFunction(set,&local_12a0);
  PragmaFunction::~PragmaFunction(&local_12a0);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_optimizer",&local_1c99);
  PragmaFunction::PragmaStatement(&local_13b8,&local_1c98,PragmaDisableOptimizer);
  BuiltinFunctions::AddFunction(set,&local_13b8);
  PragmaFunction::~PragmaFunction(&local_13b8);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"force_checkpoint",&local_1c99);
  PragmaFunction::PragmaStatement(&local_14d0,&local_1c98,PragmaForceCheckpoint);
  BuiltinFunctions::AddFunction(set,&local_14d0);
  PragmaFunction::~PragmaFunction(&local_14d0);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"truncate_duckdb_logs",&local_1c99);
  PragmaFunction::PragmaStatement(&local_15e8,&local_1c98,PragmaTruncateDuckDBLogs);
  BuiltinFunctions::AddFunction(set,&local_15e8);
  PragmaFunction::~PragmaFunction(&local_15e8);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_progress_bar",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1700,&local_1c98,PragmaEnableProgressBar);
  BuiltinFunctions::AddFunction(set,&local_1700);
  PragmaFunction::~PragmaFunction(&local_1700);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_progress_bar",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1818,&local_1c98,PragmaDisableProgressBar);
  BuiltinFunctions::AddFunction(set,&local_1818);
  PragmaFunction::~PragmaFunction(&local_1818);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_print_progress_bar",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1930,&local_1c98,PragmaEnablePrintProgressBar);
  BuiltinFunctions::AddFunction(set,&local_1930);
  PragmaFunction::~PragmaFunction(&local_1930);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_print_progress_bar",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1a48,&local_1c98,PragmaDisablePrintProgressBar);
  BuiltinFunctions::AddFunction(set,&local_1a48);
  PragmaFunction::~PragmaFunction(&local_1a48);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"enable_checkpoint_on_shutdown",&local_1c99);
  PragmaFunction::PragmaStatement(&local_1b60,&local_1c98,PragmaEnableCheckpointOnShutdown);
  BuiltinFunctions::AddFunction(set,&local_1b60);
  PragmaFunction::~PragmaFunction(&local_1b60);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  ::std::__cxx11::string::string((string *)&local_1c98,"disable_checkpoint_on_shutdown",&local_1c99)
  ;
  PragmaFunction::PragmaStatement(&local_1c78,&local_1c98,PragmaDisableCheckpointOnShutdown);
  BuiltinFunctions::AddFunction(set,&local_1c78);
  PragmaFunction::~PragmaFunction(&local_1c78);
  ::std::__cxx11::string::~string((string *)&local_1c98);
  return;
}

Assistant:

void PragmaFunctions::RegisterFunction(BuiltinFunctions &set) {
	RegisterEnableProfiling(set);

	set.AddFunction(PragmaFunction::PragmaStatement("disable_profile", PragmaDisableProfiling));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_profiling", PragmaDisableProfiling));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_verification", PragmaEnableVerification));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_verification", PragmaDisableVerification));

	set.AddFunction(PragmaFunction::PragmaStatement("verify_external", PragmaEnableExternalVerification));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_verify_external", PragmaDisableExternalVerification));

	set.AddFunction(PragmaFunction::PragmaStatement("verify_fetch_row", PragmaEnableFetchRowVerification));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_verify_fetch_row", PragmaDisableFetchRowVerification));

	set.AddFunction(PragmaFunction::PragmaStatement("verify_serializer", PragmaVerifySerializer));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_verify_serializer", PragmaDisableVerifySerializer));

	set.AddFunction(PragmaFunction::PragmaStatement("verify_parallelism", PragmaEnableForceParallelism));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_verify_parallelism", PragmaDisableForceParallelism));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_object_cache", PragmaEnableObjectCache));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_object_cache", PragmaDisableObjectCache));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_logging", PragmaEnableLogging));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_logging", PragmaDisableLogging));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_optimizer", PragmaEnableOptimizer));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_optimizer", PragmaDisableOptimizer));

	set.AddFunction(PragmaFunction::PragmaStatement("force_checkpoint", PragmaForceCheckpoint));

	set.AddFunction(PragmaFunction::PragmaStatement("truncate_duckdb_logs", PragmaTruncateDuckDBLogs));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_progress_bar", PragmaEnableProgressBar));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_progress_bar", PragmaDisableProgressBar));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_print_progress_bar", PragmaEnablePrintProgressBar));
	set.AddFunction(PragmaFunction::PragmaStatement("disable_print_progress_bar", PragmaDisablePrintProgressBar));

	set.AddFunction(PragmaFunction::PragmaStatement("enable_checkpoint_on_shutdown", PragmaEnableCheckpointOnShutdown));
	set.AddFunction(
	    PragmaFunction::PragmaStatement("disable_checkpoint_on_shutdown", PragmaDisableCheckpointOnShutdown));
}